

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O1

size_t FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  FSE_DTable *dt;
  byte bVar1;
  long lVar2;
  uchar uVar3;
  uint uVar4;
  BIT_DStream_status BVar5;
  ulong uVar6;
  uchar *puVar7;
  long lVar8;
  int iVar9;
  FSE_DState_t *pFVar10;
  uchar *puVar11;
  short *psVar12;
  size_t sVar13;
  size_t sVar14;
  void *pvVar15;
  long lVar16;
  size_t sVar17;
  bool bVar18;
  FSE_DState_t state1;
  uint maxSymbolValue;
  uint tableLog;
  BIT_DStream_t local_a8;
  FSE_DState_t local_80;
  FSE_DState_t local_70;
  void *local_60;
  uchar *local_58;
  short *local_50;
  ulong *local_48;
  ulong *local_40;
  uint local_38;
  uint local_34;
  
  local_38 = 0xff;
  if (wkspSize < 0x204) {
    return 0xffffffffffffffff;
  }
  local_60 = dst;
  local_50 = (short *)workSpace;
  local_40 = (ulong *)dstCapacity;
  uVar6 = FSE_readNCount_bmi2((short *)workSpace,&local_38,&local_34,cSrc,cSrcSize,0);
  psVar12 = local_50;
  if (uVar6 < 0xffffffffffffff89) {
    if (local_34 <= maxLog) {
      bVar18 = cSrcSize < uVar6;
      cSrcSize = cSrcSize - uVar6;
      if (bVar18) {
        __assert_fail("NCountLength <= cSrcSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/fse_decompress.c"
                      ,0x108,
                      "size_t FSE_decompress_wksp_body(void *, size_t, const void *, size_t, unsigned int, void *, size_t, int)"
                     );
      }
      cSrc = (void *)((long)cSrc + uVar6);
      bVar18 = true;
      goto LAB_0021692c;
    }
    uVar6 = 0xffffffffffffffd4;
  }
  bVar18 = false;
LAB_0021692c:
  if (bVar18) {
    lVar8 = (long)(1 << ((byte)local_34 & 0x1f));
    uVar6 = 0xffffffffffffffd4;
    if (((1L << ((byte)local_34 & 0x3f)) + (ulong)(local_38 + 1) * 2 + lVar8 * 4 + 0x13 &
        0xfffffffffffffffc) + 0x204 <= wkspSize) {
      uVar6 = lVar8 * 4 + 0x208;
      if (wkspSize < uVar6) {
        __assert_fail("sizeof(*wksp) + FSE_DTABLE_SIZE(tableLog) <= wkspSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/fse_decompress.c"
                      ,0x10e,
                      "size_t FSE_decompress_wksp_body(void *, size_t, const void *, size_t, unsigned int, void *, size_t, int)"
                     );
      }
      dt = (FSE_DTable *)(local_50 + 0x100);
      uVar6 = FSE_buildDTable_internal
                        (dt,local_50,local_38,local_34,local_50 + lVar8 * 2 + 0x104,wkspSize - uVar6
                        );
      pvVar15 = local_60;
      if (uVar6 < 0xffffffffffffff89) {
        local_58 = (uchar *)((long)local_40 + (long)local_60);
        local_50 = (short *)((long)local_60 + ((long)local_40 - 3U));
        uVar6 = cSrcSize;
        local_a8.ptr = (char *)cSrc;
        local_a8.start = (char *)cSrc;
        if (psVar12[0x101] == 0) {
          if (cSrcSize == 0) {
            local_a8.ptr = (char *)0x0;
            local_a8.start = (char *)0x0;
            local_a8.bitContainer = 0;
            local_a8.bitsConsumed = 0;
            local_a8._12_4_ = 0;
            local_a8.limitPtr = (char *)0x0;
            uVar6 = 0xffffffffffffffb8;
          }
          else {
            local_a8.limitPtr = (char *)((long)cSrc + 8);
            if (cSrcSize < 8) {
              local_a8.bitContainer = (size_t)(byte)*cSrc;
              switch(cSrcSize) {
              case 7:
                local_a8.bitContainer =
                     (ulong)*(byte *)((long)cSrc + 6) << 0x30 | local_a8.bitContainer;
              case 6:
                local_a8.bitContainer =
                     local_a8.bitContainer + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
              case 5:
                local_a8.bitContainer =
                     local_a8.bitContainer + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
              case 4:
                local_a8.bitContainer =
                     local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
              case 3:
                local_a8.bitContainer =
                     local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
              case 2:
                local_a8.bitContainer =
                     local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
              default:
                bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
                uVar4 = 0x1f;
                if (bVar1 != 0) {
                  for (; bVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                  }
                }
                if (bVar1 == 0) {
                  uVar6 = 0xffffffffffffffec;
                  local_a8.bitsConsumed = 0;
                }
                else {
                  local_a8.bitsConsumed = ~uVar4 + (int)cSrcSize * -8 + 0x49;
                }
              }
            }
            else {
              local_a8.ptr = (char *)((long)cSrc + (cSrcSize - 8));
              local_a8.bitContainer = *(size_t *)local_a8.ptr;
              bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
              uVar4 = 0x1f;
              if (bVar1 != 0) {
                for (; bVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                }
              }
              local_a8.bitsConsumed = ~uVar4 + 9;
              if (bVar1 == 0) {
                local_a8.bitsConsumed = 0;
                uVar6 = 0xffffffffffffffff;
              }
            }
          }
          if (uVar6 < 0xffffffffffffff89) {
            FSE_initDState(&local_70,&local_a8,dt);
            FSE_initDState(&local_80,&local_a8,dt);
            local_40 = (ulong *)local_a8.limitPtr;
            lVar8 = 0;
            sVar17 = local_80.state;
            do {
              if (local_a8.bitsConsumed < 0x41) {
                if (local_a8.ptr < local_a8.limitPtr) {
                  if (local_a8.ptr == local_a8.start) goto LAB_00216feb;
                  bVar18 = local_a8.start <=
                           (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3));
                  uVar4 = (int)local_a8.ptr - (int)local_a8.start;
                  if (bVar18) {
                    uVar4 = local_a8.bitsConsumed >> 3;
                  }
                  local_a8.bitsConsumed = local_a8.bitsConsumed + uVar4 * -8;
                }
                else {
                  uVar4 = local_a8.bitsConsumed >> 3;
                  local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
                  bVar18 = true;
                }
                local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar4);
                local_a8.bitContainer = *(size_t *)local_a8.ptr;
              }
              else {
LAB_00216feb:
                bVar18 = false;
              }
              puVar7 = (uchar *)((long)pvVar15 + lVar8);
              sVar13 = local_70.state;
              if ((local_50 <= puVar7) || (!bVar18)) {
                local_58 = local_58 + -2;
                local_80.state = sVar17;
                if (local_58 < puVar7) {
                  return 0xffffffffffffffba;
                }
                goto LAB_00217195;
              }
              bVar1 = *(byte *)((long)local_70.table + local_70.state * 4 + 3);
              if (0x1f < bVar1) goto LAB_00217492;
              local_a8.bitsConsumed = local_a8.bitsConsumed + bVar1;
              sVar13 = (~(-1L << (bVar1 & 0x3f)) &
                       local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)) +
                       (ulong)*(ushort *)((long)local_70.table + local_70.state * 4);
              *puVar7 = *(uchar *)((long)local_70.table + local_70.state * 4 + 2);
              bVar1 = *(byte *)((long)local_80.table + sVar17 * 4 + 3);
              if (0x1f < bVar1) goto LAB_00217492;
              local_a8.bitsConsumed = local_a8.bitsConsumed + bVar1;
              sVar14 = (~(-1L << (bVar1 & 0x3f)) &
                       local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)) +
                       (ulong)*(ushort *)((long)local_80.table + sVar17 * 4);
              *(undefined1 *)((long)local_60 + lVar8 + 1) =
                   *(undefined1 *)((long)local_80.table + sVar17 * 4 + 2);
              bVar1 = *(byte *)((long)local_70.table + sVar13 * 4 + 3);
              sVar17 = sVar14;
              if (0x1f < bVar1) goto LAB_00217492;
              local_a8.bitsConsumed = local_a8.bitsConsumed + bVar1;
              local_70.state =
                   (~(-1L << (bVar1 & 0x3f)) &
                   local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)) +
                   (ulong)*(ushort *)((long)local_70.table + sVar13 * 4);
              *(undefined1 *)((long)local_60 + lVar8 + 2) =
                   *(undefined1 *)((long)local_70.table + sVar13 * 4 + 2);
              bVar1 = *(byte *)((long)local_80.table + sVar14 * 4 + 3);
              sVar13 = local_70.state;
              if (0x1f < bVar1) goto LAB_00217492;
              local_a8.bitsConsumed = local_a8.bitsConsumed + bVar1;
              sVar17 = (~(-1L << (bVar1 & 0x3f)) &
                       local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)) +
                       (ulong)*(ushort *)((long)local_80.table + sVar14 * 4);
              *(undefined1 *)((long)local_60 + lVar8 + 3) =
                   *(undefined1 *)((long)local_80.table + sVar14 * 4 + 2);
              lVar8 = lVar8 + 4;
              pvVar15 = local_60;
            } while( true );
          }
        }
        else {
          if (cSrcSize == 0) {
            local_a8.ptr = (char *)0x0;
            local_a8.start = (char *)0x0;
            local_a8.bitContainer = 0;
            local_a8.bitsConsumed = 0;
            local_a8._12_4_ = 0;
            local_a8.limitPtr = (char *)0x0;
            uVar6 = 0xffffffffffffffb8;
          }
          else {
            local_a8.limitPtr = (char *)((long)cSrc + 8);
            if (cSrcSize < 8) {
              local_a8.bitContainer = (size_t)(byte)*cSrc;
              switch(cSrcSize) {
              case 7:
                local_a8.bitContainer =
                     (ulong)*(byte *)((long)cSrc + 6) << 0x30 | local_a8.bitContainer;
              case 6:
                local_a8.bitContainer =
                     local_a8.bitContainer + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
              case 5:
                local_a8.bitContainer =
                     local_a8.bitContainer + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
              case 4:
                local_a8.bitContainer =
                     local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
              case 3:
                local_a8.bitContainer =
                     local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
              case 2:
                local_a8.bitContainer =
                     local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
              default:
                bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
                uVar4 = 0x1f;
                if (bVar1 != 0) {
                  for (; bVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                  }
                }
                if (bVar1 == 0) {
                  uVar6 = 0xffffffffffffffec;
                  local_a8.bitsConsumed = 0;
                }
                else {
                  local_a8.bitsConsumed = ~uVar4 + (int)cSrcSize * -8 + 0x49;
                }
              }
            }
            else {
              local_a8.ptr = (char *)((long)cSrc + (cSrcSize - 8));
              local_a8.bitContainer = *(size_t *)local_a8.ptr;
              bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
              uVar4 = 0x1f;
              if (bVar1 != 0) {
                for (; bVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                }
              }
              local_a8.bitsConsumed = ~uVar4 + 9;
              if (bVar1 == 0) {
                local_a8.bitsConsumed = 0;
                uVar6 = 0xffffffffffffffff;
              }
            }
          }
          if (uVar6 < 0xffffffffffffff89) {
            FSE_initDState(&local_70,&local_a8,dt);
            FSE_initDState(&local_80,&local_a8,dt);
            local_40 = (ulong *)local_a8.limitPtr;
            local_48 = (ulong *)local_a8.start;
            lVar8 = 0;
            do {
              iVar9 = (int)local_a8.start;
              if (local_a8.bitsConsumed < 0x41) {
                if (local_a8.ptr < local_a8.limitPtr) {
                  if (local_a8.ptr == local_a8.start) goto LAB_00216cba;
                  bVar18 = local_a8.start <=
                           (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3));
                  uVar4 = (int)local_a8.ptr - iVar9;
                  if (bVar18) {
                    uVar4 = local_a8.bitsConsumed >> 3;
                  }
                  local_a8.bitsConsumed = local_a8.bitsConsumed + uVar4 * -8;
                }
                else {
                  uVar4 = local_a8.bitsConsumed >> 3;
                  local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
                  bVar18 = true;
                }
                local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar4);
                local_a8.bitContainer = *(size_t *)local_a8.ptr;
              }
              else {
LAB_00216cba:
                bVar18 = false;
              }
              puVar7 = (uchar *)((long)pvVar15 + lVar8);
              if ((local_50 <= puVar7) || (!bVar18)) {
                local_58 = local_58 + -2;
                goto joined_r0x00216e21;
              }
              bVar1 = *(byte *)((long)local_70.table + local_70.state * 4 + 3);
              if (bVar1 == 0) {
                goto LAB_002174c8;
              }
              lVar16 = local_70.state * 4;
              uVar4 = local_a8.bitsConsumed + bVar1;
              local_70.state =
                   ((local_a8.bitContainer << ((byte)local_a8.bitsConsumed & 0x3f)) >>
                   (-bVar1 & 0x3f)) + (ulong)*(ushort *)((long)local_70.table + local_70.state * 4);
              *puVar7 = *(uchar *)((long)local_70.table + lVar16 + 2);
              bVar1 = *(byte *)((long)local_80.table + local_80.state * 4 + 3);
              if (bVar1 == 0) {
                local_a8.bitsConsumed = uVar4;
                goto LAB_002174c8;
              }
              lVar16 = local_80.state * 4;
              local_a8.bitsConsumed = uVar4 + bVar1;
              local_80.state =
                   ((local_a8.bitContainer << ((byte)uVar4 & 0x3f)) >> (-bVar1 & 0x3f)) +
                   (ulong)*(ushort *)((long)local_80.table + local_80.state * 4);
              *(undefined1 *)((long)local_60 + lVar8 + 1) =
                   *(undefined1 *)((long)local_80.table + lVar16 + 2);
              bVar1 = *(byte *)((long)local_70.table + local_70.state * 4 + 3);
              if (bVar1 == 0) goto LAB_00217402;
              lVar16 = local_70.state * 4;
              local_70.state =
                   ((local_a8.bitContainer << ((byte)local_a8.bitsConsumed & 0x3f)) >>
                   (-bVar1 & 0x3f)) + (ulong)*(ushort *)((long)local_70.table + local_70.state * 4);
              local_a8.bitsConsumed = local_a8.bitsConsumed + bVar1;
              *(undefined1 *)((long)local_60 + lVar8 + 2) =
                   *(undefined1 *)((long)local_70.table + lVar16 + 2);
              bVar1 = *(byte *)((long)local_80.table + local_80.state * 4 + 3);
              if (bVar1 == 0) goto LAB_00217402;
              lVar16 = local_80.state * 4;
              local_80.state =
                   ((local_a8.bitContainer << ((byte)local_a8.bitsConsumed & 0x3f)) >>
                   (-bVar1 & 0x3f)) + (ulong)*(ushort *)((long)local_80.table + local_80.state * 4);
              local_a8.bitsConsumed = local_a8.bitsConsumed + bVar1;
              *(undefined1 *)((long)local_60 + lVar8 + 3) =
                   *(undefined1 *)((long)local_80.table + lVar16 + 2);
              lVar8 = lVar8 + 4;
              pvVar15 = local_60;
            } while( true );
          }
        }
      }
    }
  }
  return uVar6;
LAB_00217195:
  bVar1 = *(byte *)((long)local_70.table + sVar13 * 4 + 3);
  if (0x1f < bVar1) {
LAB_00217492:
    local_70.state = sVar13;
    local_80.state = sVar17;
    __assert_fail("nbBits < BIT_MASK_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/bitstream.h"
                  ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
  }
  local_a8.bitsConsumed = bVar1 + local_a8.bitsConsumed;
  lVar16 = sVar13 * 4;
  sVar13 = (~(-1L << (bVar1 & 0x3f)) &
           local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)) +
           (ulong)*(ushort *)((long)local_70.table + sVar13 * 4);
  puVar11 = (undefined1 *)((long)local_60 + lVar8) + 1;
  *(undefined1 *)((long)local_60 + lVar8) = *(undefined1 *)((long)local_70.table + lVar16 + 2);
  if (0x40 < local_a8.bitsConsumed) {
    lVar16 = 2;
    pFVar10 = &local_80;
LAB_002173b8:
    local_80.state = sVar17;
    local_70.state = sVar13;
    uVar3 = FSE_decodeSymbol(pFVar10,&local_a8);
    *puVar11 = uVar3;
    goto LAB_002173ce;
  }
  if (local_a8.ptr < local_a8.limitPtr) {
    psVar12 = (short *)puVar11;
    if (local_a8.ptr != local_a8.start) {
      uVar4 = (int)local_a8.ptr - (int)local_a8.start;
      if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3))) {
        uVar4 = local_a8.bitsConsumed >> 3;
      }
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar4);
      local_a8.bitsConsumed = local_a8.bitsConsumed + uVar4 * -8;
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
    }
  }
  else {
    local_50 = (short *)puVar11;
    BVar5 = BIT_reloadDStreamFast(&local_a8);
    psVar12 = local_50;
    if (BVar5 == BIT_DStream_overflow) {
      puVar11 = puVar7 + 1;
      lVar16 = 2;
      pFVar10 = &local_80;
      goto LAB_002173b8;
    }
  }
  if (local_58 < psVar12) {
    return 0xffffffffffffffba;
  }
  bVar1 = *(byte *)((long)local_80.table + sVar17 * 4 + 3);
  if (0x1f < bVar1) goto LAB_00217492;
  local_a8.bitsConsumed = bVar1 + local_a8.bitsConsumed;
  lVar16 = sVar17 * 4;
  sVar17 = (~(-1L << (bVar1 & 0x3f)) &
           local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)) +
           (ulong)*(ushort *)((long)local_80.table + sVar17 * 4);
  puVar11 = puVar7 + 2;
  *(uchar *)psVar12 = *(uchar *)((long)local_80.table + lVar16 + 2);
  if (0x40 < local_a8.bitsConsumed) {
LAB_002173ad:
    pFVar10 = &local_70;
    lVar16 = 3;
    goto LAB_002173b8;
  }
  if (local_a8.ptr < local_a8.limitPtr) {
    if (local_a8.ptr != local_a8.start) {
      uVar4 = (int)local_a8.ptr - (int)local_a8.start;
      if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3))) {
        uVar4 = local_a8.bitsConsumed >> 3;
      }
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar4);
      local_a8.bitsConsumed = local_a8.bitsConsumed + uVar4 * -8;
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
    }
  }
  else {
    BVar5 = BIT_reloadDStreamFast(&local_a8);
    if (BVar5 == BIT_DStream_overflow) {
      puVar11 = (uchar *)((long)local_60 + lVar8 + 2);
      goto LAB_002173ad;
    }
  }
  lVar16 = lVar8 + 2;
  lVar8 = lVar8 + 2;
  puVar7 = puVar11;
  if (local_58 < (uchar *)((long)local_60 + lVar16)) {
    return 0xffffffffffffffba;
  }
  goto LAB_00217195;
joined_r0x00216e21:
  if (local_58 < puVar7) {
    return 0xffffffffffffffba;
  }
  bVar1 = *(byte *)((long)local_70.table + local_70.state * 4 + 3);
  if (bVar1 == 0) {
LAB_002174b1:
    goto LAB_002174c8;
  }
  lVar16 = local_70.state * 4;
  local_70.state =
       ((local_a8.bitContainer << ((byte)local_a8.bitsConsumed & 0x3f)) >> (-bVar1 & 0x3f)) +
       (ulong)*(ushort *)((long)local_70.table + local_70.state * 4);
  local_a8.bitsConsumed = local_a8.bitsConsumed + bVar1;
  *(undefined1 *)((long)pvVar15 + lVar8) = *(undefined1 *)((long)local_70.table + lVar16 + 2);
  if (0x40 < local_a8.bitsConsumed) {
    lVar2 = lVar8 + 1;
    lVar16 = 2;
    pFVar10 = &local_80;
    goto LAB_00217360;
  }
  if (local_a8.ptr < local_a8.limitPtr) {
    if (local_a8.ptr != local_a8.start) {
      uVar4 = (int)local_a8.ptr - iVar9;
      if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3))) {
        uVar4 = local_a8.bitsConsumed >> 3;
      }
      local_a8.bitsConsumed = local_a8.bitsConsumed + uVar4 * -8;
      goto LAB_00216ebe;
    }
  }
  else {
    uVar4 = local_a8.bitsConsumed >> 3;
    local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
LAB_00216ebe:
    local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar4);
    local_a8.bitContainer = *(size_t *)local_a8.ptr;
  }
  puVar7 = (uchar *)((long)pvVar15 + lVar8 + 1);
  if (local_58 < puVar7) {
    return 0xffffffffffffffba;
  }
  bVar1 = *(byte *)((long)local_80.table + local_80.state * 4 + 3);
  if (bVar1 == 0) goto LAB_002174b1;
  lVar16 = local_80.state * 4;
  local_80.state =
       ((local_a8.bitContainer << ((byte)local_a8.bitsConsumed & 0x3f)) >> (-bVar1 & 0x3f)) +
       (ulong)*(ushort *)((long)local_80.table + local_80.state * 4);
  local_a8.bitsConsumed = local_a8.bitsConsumed + bVar1;
  *puVar7 = *(uchar *)((long)local_80.table + lVar16 + 2);
  if (0x40 < local_a8.bitsConsumed) {
    lVar2 = lVar8 + 2;
    lVar16 = 3;
    pFVar10 = &local_70;
LAB_00217360:
    puVar7 = (uchar *)((long)local_60 + lVar2);
    uVar3 = FSE_decodeSymbolFast(pFVar10,&local_a8);
    *puVar7 = uVar3;
LAB_002173ce:
    return lVar16 + lVar8;
  }
  if (local_a8.ptr < local_a8.limitPtr) {
    if (local_a8.ptr != local_a8.start) {
      uVar4 = (int)local_a8.ptr - iVar9;
      if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3))) {
        uVar4 = local_a8.bitsConsumed >> 3;
      }
      local_a8.bitsConsumed = local_a8.bitsConsumed + uVar4 * -8;
      goto LAB_00216f56;
    }
  }
  else {
    uVar4 = local_a8.bitsConsumed >> 3;
    local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
LAB_00216f56:
    local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar4);
    local_a8.bitContainer = *(size_t *)local_a8.ptr;
  }
  puVar7 = (uchar *)((long)local_60 + lVar8 + 2);
  lVar8 = lVar8 + 2;
  goto joined_r0x00216e21;
LAB_00217402:
LAB_002174c8:
  __assert_fail("nbBits >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/bitstream.h"
                ,0x15d,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}